

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fidentity16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i a;
  __m256i a_00;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long in_RSI;
  long in_RDI;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  longlong lVar8;
  undefined1 auVar9 [16];
  __m256i b_hi;
  __m256i b_lo;
  __m256i a_hi;
  __m256i a_lo;
  int i;
  __m256i one;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined4 local_184;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  auVar9 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar9 = vpinsrw_avx(auVar9,1,2);
  auVar9 = vpinsrw_avx(auVar9,1,3);
  auVar9 = vpinsrw_avx(auVar9,1,4);
  auVar9 = vpinsrw_avx(auVar9,1,5);
  auVar9 = vpinsrw_avx(auVar9,1,6);
  auVar9 = vpinsrw_avx(auVar9,1,7);
  auVar6 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar6 = vpinsrw_avx(auVar6,1,2);
  auVar6 = vpinsrw_avx(auVar6,1,3);
  auVar6 = vpinsrw_avx(auVar6,1,4);
  auVar6 = vpinsrw_avx(auVar6,1,5);
  auVar6 = vpinsrw_avx(auVar6,1,6);
  auVar6 = vpinsrw_avx(auVar6,1,7);
  auVar6 = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar6;
  auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
  for (local_184 = 0; uStack_168 = auVar9._8_8_, uStack_170 = auVar9._0_8_, local_184 < 0x10;
      local_184 = local_184 + 1) {
    auVar1._16_8_ = uStack_170;
    auVar1._0_16_ = auVar6;
    auVar1._24_8_ = uStack_168;
    auVar2 = vpunpcklwd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_184 * 0x20),auVar1);
    auVar3._16_8_ = uStack_170;
    auVar3._0_16_ = auVar6;
    auVar3._24_8_ = uStack_168;
    auVar1 = vpunpckhwd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_184 * 0x20),auVar3);
    uVar5 = auVar1._0_8_;
    uVar7 = auVar1._8_8_;
    lVar8 = auVar1._16_8_;
    uStack_1c8 = auVar1._24_8_;
    local_1c0 = auVar2._0_8_;
    uStack_1b8 = auVar2._8_8_;
    uStack_1b0 = auVar2._16_8_;
    uStack_1a8 = auVar2._24_8_;
    a[1] = uVar5;
    a[0] = in_stack_fffffffffffffe18;
    a[2] = uVar7;
    a[3] = lVar8;
    scale_round_avx2(a,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    a_00[1] = uVar5;
    a_00[0] = uStack_1a8;
    a_00[2] = uVar7;
    a_00[3] = lVar8;
    scale_round_avx2(a_00,(int)((ulong)uStack_1b0 >> 0x20));
    auVar4._8_8_ = uStack_1b8;
    auVar4._0_8_ = local_1c0;
    auVar4._16_8_ = uStack_1b0;
    auVar4._24_8_ = uStack_1a8;
    auVar2._8_8_ = uVar7;
    auVar2._0_8_ = uVar5;
    auVar2._16_8_ = lVar8;
    auVar2._24_8_ = uStack_1c8;
    auVar1 = vpackssdw_avx2(auVar4,auVar2);
    *(undefined1 (*) [32])(in_RSI + (long)local_184 * 0x20) = auVar1;
    in_stack_fffffffffffffe10 = uStack_1b0;
    in_stack_fffffffffffffe18 = uStack_1a8;
  }
  return;
}

Assistant:

static inline void fidentity16x16_new_avx2(const __m256i *input,
                                           __m256i *output, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i one = _mm256_set1_epi16(1);

  for (int i = 0; i < 16; ++i) {
    const __m256i a_lo = _mm256_unpacklo_epi16(input[i], one);
    const __m256i a_hi = _mm256_unpackhi_epi16(input[i], one);
    const __m256i b_lo = scale_round_avx2(a_lo, 2 * NewSqrt2);
    const __m256i b_hi = scale_round_avx2(a_hi, 2 * NewSqrt2);
    output[i] = _mm256_packs_epi32(b_lo, b_hi);
  }
}